

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O1

void extendText(cmGeneratorExpressionEvaluatorVector *result,const_iterator it)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  pointer puVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  pointer *__ptr;
  __uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  local_18;
  
  puVar2 = (result->
           super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((result->
       super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start != puVar2) &&
     (iVar5 = (*(puVar2[-1]._M_t.
                 super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl)->
                _vptr_cmGeneratorExpressionEvaluator[2])(), iVar5 == 0)) {
    pcVar1 = (result->
             super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
             .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl + 2;
    pcVar1->_vptr_cmGeneratorExpressionEvaluator =
         (_func_int **)
         ((long)pcVar1->_vptr_cmGeneratorExpressionEvaluator + (it._M_current)->Length);
    return;
  }
  local_18._M_t.
  super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl =
       (tuple<cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
        )operator_new(0x18);
  pcVar3 = (it._M_current)->Content;
  sVar4 = (it._M_current)->Length;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
   .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl =
       &PTR__cmGeneratorExpressionEvaluator_009c2390;
  *(char **)((long)local_18._M_t.
                   super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                   .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl + 8)
       = pcVar3;
  *(size_t *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
          .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl + 0x10) =
       sVar4;
  std::
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>>
  ::
  emplace_back<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>
            ((vector<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>>
              *)result,
             (unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
              *)&local_18);
  if ((_Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
       )local_18._M_t.
        super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
        .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl !=
      (cmGeneratorExpressionEvaluator *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                          .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>.
                          _M_head_impl + 8))();
  }
  return;
}

Assistant:

static void extendText(
  cmGeneratorExpressionEvaluatorVector& result,
  std::vector<cmGeneratorExpressionToken>::const_iterator it)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text) {
    cm::static_reference_cast<TextContent>(*(result.end() - 1))
      .Extend(it->Length);
  } else {
    auto textContent = cm::make_unique<TextContent>(it->Content, it->Length);
    result.push_back(std::move(textContent));
  }
}